

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::CreateInvalidAttribsTest::iterate(CreateInvalidAttribsTest *this)

{
  int iVar1;
  deBool dVar2;
  Library *pLVar3;
  TestLog *this_00;
  undefined4 extraout_var;
  MessageBuilder *pMVar4;
  TestError *this_01;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_4f8;
  MessageBuilder local_4e8;
  MessageBuilder local_368;
  int local_1e4;
  char *pcStack_1e0;
  EGLint error;
  MessageBuilder local_1c8;
  undefined4 uStack_48;
  undefined4 uStack_44;
  EGLint attribs [5];
  TestLog *log;
  Library *egl;
  CreateInvalidAttribsTest *this_local;
  
  pLVar3 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  this_00 = tcu::TestContext::getLog
                      ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                      );
  uStack_48 = 2;
  uStack_44 = 3;
  attribs[0] = 4;
  attribs[1] = 5;
  attribs[2] = 0x3038;
  iVar1 = (*pLVar3->_vptr_Library[0x11])
                    (pLVar3,(this->super_SyncTest).m_eglDisplay,
                     (ulong)(this->super_SyncTest).m_syncType,&uStack_48);
  (this->super_SyncTest).m_sync = (EGLSyncKHR)CONCAT44(extraout_var,iVar1);
  tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1c8,&(this->super_SyncTest).m_sync);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])" = eglCreateSyncKHR(");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_eglDisplay);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
  pcStack_1e0 = getSyncTypeName((this->super_SyncTest).m_syncType);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&stack0xfffffffffffffe20);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [28])", { 2, 3, 4, 5, EGL_NONE })");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  local_1e4 = (*pLVar3->_vptr_Library[0x1f])();
  tcu::TestLog::operator<<(&local_368,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_368,&local_1e4);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])" = eglGetError()");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_368);
  if (local_1e4 == 0x3004) {
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) || ((this->super_SyncTest).m_sync != (EGLSyncKHR)0x0)) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,"m_sync == EGL_NO_SYNC_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x19b);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestLog::operator<<(&local_4e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_4e8,(char (*) [19])"Unexpected error \'");
    EVar5 = eglu::getErrorStr(local_1e4);
    local_4f8.m_getName = EVar5.m_getName;
    local_4f8.m_value = EVar5.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_4f8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [29])"\' expected EGL_BAD_ATTRIBUTE");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4e8);
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

IterateResult	iterate						(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		EGLint attribs[] = {
			2, 3, 4, 5,
			EGL_NONE
		};

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, attribs);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", { 2, 3, 4, 5, EGL_NONE })" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_ATTRIBUTE)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_ATTRIBUTE" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(m_sync == EGL_NO_SYNC_KHR);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}